

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O0

SleighArchitecture * __thiscall
SleighArchitecture::normalizeProcessor(SleighArchitecture *this,string *nm)

{
  long lVar1;
  allocator local_19;
  string *local_18;
  string *nm_local;
  
  local_18 = (string *)nm;
  nm_local = (string *)this;
  lVar1 = std::__cxx11::string::find((char *)nm,0x74340d);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)this,local_18);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"x86",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return this;
}

Assistant:

string SleighArchitecture::normalizeProcessor(const string &nm)

{
  if (nm.find("386")!=string::npos)
    return "x86";
  return nm;
}